

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::T_formatter<spdlog::details::scoped_padder>::format
          (T_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  format_string_checker<char,_1,_0,_false> *pfVar2;
  size_t sVar3;
  byte bVar4;
  memory_buf_t *handler;
  buffer<char> *buf;
  ulong uVar5;
  basic_string_view<char> fmt;
  string_view fmt_00;
  basic_string_view<char> fmt_01;
  string_view fmt_02;
  basic_string_view<char> fmt_03;
  string_view fmt_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  scoped_padder p;
  uint local_88 [2];
  undefined8 local_80;
  undefined4 local_78;
  char *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  code *local_50;
  scoped_padder local_48;
  
  handler = dest;
  scoped_padder::scoped_padder(&local_48,8,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt.size_ = (size_t)local_88;
    fmt.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt,(format_string_checker<char,_1,_0,_false> *)handler);
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args.desc_ = 1;
    local_88[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar5 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
  }
  pfVar2 = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar5;
  *(undefined1 *)((long)pfVar2->types_ + sVar3) = 0x3a;
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_01.size_ = (size_t)local_88;
    fmt_01.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_01,pfVar2);
    fmt_02.size_ = 5;
    fmt_02.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args_00.desc_ = 1;
    local_88[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_02,args_00,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar5 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
  }
  pfVar2 = (format_string_checker<char,_1,_0,_false> *)(dest->super_buffer<char>).ptr_;
  (dest->super_buffer<char>).size_ = uVar5;
  *(undefined1 *)((long)pfVar2->types_ + sVar3) = 0x3a;
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar5 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar5;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    local_88[0] = 1;
    local_80 = 0;
    local_78 = 0;
    local_70 = "{:02}";
    local_68 = 5;
    local_60 = 0x100000000;
    local_50 = ::fmt::v11::detail::invoke_parse<int&,char>;
    fmt_03.size_ = (size_t)local_88;
    fmt_03.data_ = (char *)0x5;
    local_58 = (undefined1 *)local_88;
    ::fmt::v11::detail::
    parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:02}",fmt_03,pfVar2);
    fmt_04.size_ = 5;
    fmt_04.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_88;
    args_01.desc_ = 1;
    local_88[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_04,args_01,(locale_ref)0x0);
  }
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 8;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
    }